

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeWingedEdges
          (ChTriangleMeshConnected *this,
          map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          *winged_edges,bool allow_single_wing)

{
  int iVar1;
  uint uVar2;
  _Base_ptr p_Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pCVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> _Var10;
  _Base_ptr p_Var11;
  ulong uVar12;
  bool bVar13;
  int iVar14;
  undefined7 in_register_00000011;
  _Base_ptr p_Var15;
  int iVar16;
  ulong uVar17;
  _Rb_tree_color _Var18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>_>
  pVar23;
  multimap<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  edge_map;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_90;
  _Alloc_node local_80;
  undefined4 local_74;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  local_70;
  _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
  *local_40;
  ChTriangleMeshConnected *local_38;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,allow_single_wing);
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar8 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = (_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
              *)winged_edges;
  local_38 = this;
  if ((this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar8) {
    uVar17 = 0;
    do {
      iVar14 = pCVar8[uVar17].m_data[0];
      iVar1 = pCVar8[uVar17].m_data[1];
      iVar16 = pCVar8[uVar17].m_data[2];
      iVar4 = iVar1;
      if (iVar14 < iVar1) {
        iVar4 = iVar14;
      }
      iVar5 = iVar1;
      if (iVar1 < iVar14) {
        iVar5 = iVar14;
      }
      iVar6 = iVar16;
      if (iVar1 < iVar16) {
        iVar6 = iVar1;
      }
      if (iVar1 <= iVar16) {
        iVar1 = iVar16;
      }
      iVar7 = iVar14;
      if (iVar16 < iVar14) {
        iVar7 = iVar16;
      }
      if (iVar14 < iVar16) {
        iVar14 = iVar16;
      }
      local_90.first.second = iVar5;
      local_90.first.first = iVar4;
      iVar16 = (int)uVar17;
      p_Var3 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var15 = &local_70._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        do {
          p_Var15 = p_Var3;
          lVar19 = 0x10;
          if (((int)p_Var15[1]._M_color <= iVar4) &&
             (((int)p_Var15[1]._M_color < iVar4 || (*(int *)&p_Var15[1].field_0x4 <= iVar5)))) {
            lVar19 = 0x18;
          }
          p_Var3 = *(_Base_ptr *)((long)&p_Var15->_M_color + lVar19);
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      local_80._M_t = &local_70;
      local_90.second.first = iVar16;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::
      _M_insert_<std::pair<std::pair<int,int>const,int>,std::_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>::_Alloc_node>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_70,(_Base_ptr)0x0,p_Var15,
                 (pair<const_std::pair<int,_int>,_int> *)&local_90,&local_80);
      local_90.first.second = iVar1;
      local_90.first.first = iVar6;
      p_Var3 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var15 = &local_70._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        do {
          p_Var15 = p_Var3;
          lVar19 = 0x10;
          if (((int)p_Var15[1]._M_color <= iVar6) &&
             (((int)p_Var15[1]._M_color < iVar6 || (*(int *)&p_Var15[1].field_0x4 <= iVar1)))) {
            lVar19 = 0x18;
          }
          p_Var3 = *(_Base_ptr *)((long)&p_Var15->_M_color + lVar19);
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      local_80._M_t = &local_70;
      local_90.second.first = iVar16;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::
      _M_insert_<std::pair<std::pair<int,int>const,int>,std::_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>::_Alloc_node>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_70,(_Base_ptr)0x0,p_Var15,
                 (pair<const_std::pair<int,_int>,_int> *)&local_90,&local_80);
      local_90.first.second = iVar14;
      local_90.first.first = iVar7;
      local_90.second.first = iVar16;
      p_Var3 = local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var15 = &local_70._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        do {
          p_Var15 = p_Var3;
          lVar19 = 0x10;
          if (((int)p_Var15[1]._M_color <= iVar7) &&
             (((int)p_Var15[1]._M_color < iVar7 || (*(int *)&p_Var15[1].field_0x4 <= iVar14)))) {
            lVar19 = 0x18;
          }
          p_Var3 = *(_Base_ptr *)((long)&p_Var15->_M_color + lVar19);
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      local_80._M_t = &local_70;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::
      _M_insert_<std::pair<std::pair<int,int>const,int>,std::_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>::_Alloc_node>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_70,(_Base_ptr)0x0,p_Var15,
                 (pair<const_std::pair<int,_int>,_int> *)&local_90,&local_80);
      uVar17 = uVar17 + 1;
      pCVar8 = (local_38->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(local_38->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 2) *
               -0x5555555555555555;
    } while (uVar17 <= uVar12 && uVar12 - uVar17 != 0);
  }
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_70._M_impl.super__Rb_tree_header) {
    p_Var11 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pVar23 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_70,(key_type *)(p_Var11 + 1));
      _Var10 = pVar23.first._M_node;
      if (_Var10._M_node == pVar23.second._M_node._M_node) {
        uVar17 = 0;
        uVar20 = 0xffffffff;
        uVar21 = 0;
        uVar12 = 0xffffffff00000000;
        iVar14 = 0;
      }
      else {
        uVar22 = *(uint *)&_Var10._M_node[1]._M_parent;
        if (uVar22 == 0xffffffff) {
          uVar22 = 0xffffffff;
          uVar17 = 0;
          _Var18 = _S_red;
          uVar12 = 0xffffffff00000000;
          iVar14 = 0;
        }
        else {
          bVar13 = false;
          uVar2 = uVar22;
          do {
            p_Var9 = _Var10._M_node;
            if (bVar13) {
              _Var18 = p_Var9[1]._M_color;
              uVar17 = (ulong)*(uint *)&p_Var9[1].field_0x4;
              uVar12 = (ulong)uVar2 << 0x20;
              iVar14 = 2;
              goto LAB_0082768f;
            }
            _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            if (_Var10._M_node == pVar23.second._M_node._M_node) break;
            uVar2 = *(uint *)&_Var10._M_node[1]._M_parent;
            bVar13 = true;
          } while (uVar2 != 0xffffffff);
          _Var18 = p_Var9[1]._M_color;
          uVar17 = (ulong)*(uint *)&p_Var9[1].field_0x4;
          iVar14 = 1;
          uVar12 = 0xffffffff00000000;
        }
LAB_0082768f:
        uVar17 = uVar17 << 0x20;
        uVar21 = (ulong)_Var18;
        uVar20 = (ulong)uVar22;
      }
      if ((iVar14 == 2) || ((iVar14 == 1 && ((char)local_74 != '\0')))) {
        local_90.first = (pair<int,_int>)(uVar17 | uVar21);
        local_90.second = (pair<int,_int>)(uVar12 | uVar20);
        std::
        _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,std::pair<int,int>>,std::_Select1st<std::pair<std::pair<int,int>const,std::pair<int,int>>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
        ::_M_emplace_unique<std::pair<std::pair<int,int>,std::pair<int,int>>>(local_40,&local_90);
        *(undefined4 *)&p_Var11[1]._M_parent = 0xffffffff;
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != &local_70._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&local_70);
  return false;
}

Assistant:

bool ChTriangleMeshConnected::ComputeWingedEdges(std::map<std::pair<int, int>, std::pair<int, int>>& winged_edges,
                                                 bool allow_single_wing) const {
    bool pathological_edges = false;

    std::multimap<std::pair<int, int>, int> edge_map;

    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        edge_map.insert({medgeA, it});
        edge_map.insert({medgeB, it});
        edge_map.insert({medgeC, it});
    }

    for (auto aedge = edge_map.begin(); aedge != edge_map.end(); ++aedge) {
        auto ret = edge_map.equal_range(aedge->first);
        int nt = 0;
        std::pair<int, int> wingedge;
        std::pair<int, int> wingtri;
        wingtri.first = -1;
        wingtri.second = -1;
        for (auto fedge = ret.first; fedge != ret.second; ++fedge) {
            if (fedge->second == -1)
                break;
            wingedge.first = fedge->first.first;
            wingedge.second = fedge->first.second;
            if (nt == 0)
                wingtri.first = fedge->second;
            if (nt == 1)
                wingtri.second = fedge->second;
            ++nt;
            if (nt == 2)
                break;
        }
        if ((nt == 2) || ((nt == 1) && allow_single_wing)) {
            winged_edges.insert(
                std::pair<std::pair<int, int>, std::pair<int, int>>(wingedge, wingtri));  // ok found winged edge!
            aedge->second = -1;  // deactivate this way otherwise found again by sister
        }
        if (nt == 3) {
            pathological_edges = true;
            // GetLog() << "Warning: winged edge between "<< wing[0] << " and " << wing[1]  << " shared with more than
            // two triangles.\n";
        }
    }
    return pathological_edges;
}